

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::FieldComments_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          BytesMode bytes_mode)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  BytesMode bytes_mode_local;
  FieldDescriptor *field_local;
  string *comments;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar2 == CPPTYPE_BOOL) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               " * Note that Boolean fields may be set to 0/1 when serialized from a Java server.\n * You should avoid comparisons like {@code val === true/false} in those cases.\n"
              );
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               " * If you change this array by adding, removing or replacing elements, or if you\n * replace the array itself, then you must call the setter to update it.\n"
              );
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
  if ((TVar3 == TYPE_BYTES) && ((int)field == 2)) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               " * Note that Uint8Array is not supported on all browsers.\n * @see http://caniuse.com/Uint8Array\n"
              );
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldComments(const FieldDescriptor* field, BytesMode bytes_mode) {
  string comments;
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_BOOL) {
    comments +=
        " * Note that Boolean fields may be set to 0/1 when serialized from "
        "a Java server.\n"
        " * You should avoid comparisons like {@code val === true/false} in "
        "those cases.\n";
  }
  if (field->is_repeated()) {
    comments +=
        " * If you change this array by adding, removing or replacing "
        "elements, or if you\n"
        " * replace the array itself, then you must call the setter to "
        "update it.\n";
  }
  if (field->type() == FieldDescriptor::TYPE_BYTES && bytes_mode == BYTES_U8) {
    comments +=
        " * Note that Uint8Array is not supported on all browsers.\n"
        " * @see http://caniuse.com/Uint8Array\n";
  }
  return comments;
}